

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O1

void __thiscall OpenMD::Perturbations::Light::modifyForces(Light *this)

{
  double *pdVar1;
  undefined8 *puVar2;
  uint uVar3;
  AtomType *pAVar4;
  Snapshot *pSVar5;
  pointer pcVar6;
  DataStoragePointer DVar7;
  RealType RVar8;
  bool bVar9;
  bool bVar10;
  uint i_3;
  Molecule *pMVar11;
  pointer ppAVar12;
  RotMat3x3d *pRVar13;
  uint i_1;
  long lVar14;
  ulong uVar15;
  uint j;
  long lVar16;
  ulong uVar17;
  uint i_5;
  double (*padVar18) [3];
  long lVar19;
  SquareMatrix3<double> *pSVar20;
  double (*__return_storage_ptr__) [3];
  Atom *pAVar21;
  byte bVar22;
  undefined4 uVar23;
  double tmp;
  undefined4 uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  Vector3<double> result_1;
  Vector<double,_3U> result;
  Vector3d EF;
  Vector3d av;
  Vector3d D;
  Vector3d f;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  Vector3d J;
  Vector3d r;
  Vector3<double> result_3;
  Vector3d EFk;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  Vector3d trq;
  Mat3x3d I;
  undefined1 local_338 [16];
  double local_328;
  double local_320;
  potVec local_318;
  undefined1 local_2c8 [16];
  double local_2b8 [4];
  double local_298;
  undefined8 uStack_290;
  double local_288 [4];
  double local_268 [4];
  double local_248 [4];
  FixedChargeAdapter local_228;
  MoleculeIterator local_220;
  undefined1 local_218 [16];
  double local_208 [4];
  double local_1e8 [4];
  undefined1 local_1c8 [16];
  double local_1b8;
  double local_1a8 [3];
  RotMat3x3d *local_190;
  RotMat3x3d *local_188;
  RealType local_180;
  Molecule *local_178;
  pointer local_170;
  MultipoleAdapter local_168;
  FluctuatingChargeAdapter local_160;
  double local_158 [4];
  double local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  SquareMatrix3<double> local_b8;
  potVec local_68;
  
  bVar22 = 0;
  if (this->initialized == false) {
    initialize(this);
  }
  local_220._M_node = (_Base_ptr)0x0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  local_d8 = 0.0;
  dStack_d0 = 0.0;
  local_1e8[2] = 0.0;
  local_1e8[0] = 0.0;
  local_1e8[1] = 0.0;
  local_248[2] = 0.0;
  local_248[0] = 0.0;
  local_248[1] = 0.0;
  local_158[2] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_268[2] = 0.0;
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_208[2] = 0.0;
  local_208[0] = 0.0;
  local_208[1] = 0.0;
  local_288[2] = 0.0;
  local_288[0] = 0.0;
  local_288[1] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_2b8[2] = 0.0;
  local_2b8[0] = 0.0;
  local_2b8[1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  if (this->doLight == true) {
    local_180 = Snapshot::getTime(this->info_->sman_->currentSnapshot_);
    pMVar11 = SimInfo::beginMolecule(this->info_,&local_220);
    if (pMVar11 == (Molecule *)0x0) {
      local_320 = 0.0;
    }
    else {
      local_188 = &this->A_;
      local_190 = &this->Ainv_;
      local_320 = 0.0;
      do {
        ppAVar12 = (pMVar11->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (ppAVar12 ==
            (pMVar11->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar21 = (Atom *)0x0;
        }
        else {
          pAVar21 = *ppAVar12;
        }
        if (pAVar21 != (Atom *)0x0) {
          local_178 = pMVar11;
          do {
            local_170 = ppAVar12;
            pAVar4 = pAVar21->atomType_;
            pSVar5 = ((pAVar21->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar14 = *(long *)((long)&(pSVar5->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar21->super_StuntDouble).storage_);
            lVar16 = (long)(pAVar21->super_StuntDouble).localIndex_ * 0x18;
            local_1e8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar16);
            pdVar1 = (double *)(lVar14 + lVar16);
            local_1e8[0] = *pdVar1;
            local_1e8[1] = pdVar1[1];
            lVar14 = *(long *)((long)&(pSVar5->atomData).velocity.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar21->super_StuntDouble).storage_);
            pdVar1 = (double *)(lVar14 + lVar16);
            local_128 = *pdVar1;
            dStack_120 = pdVar1[1];
            local_138 = *(double *)(lVar14 + 0x10 + lVar16);
            uStack_130 = 0;
            local_318.data_[0] = 0.0;
            local_318.data_[1] = 0.0;
            local_318.data_[2] = 0.0;
            lVar14 = 0;
            pRVar13 = local_188;
            do {
              dVar25 = local_318.data_[lVar14];
              lVar16 = 0;
              do {
                dVar25 = dVar25 + (pRVar13->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0][lVar16] *
                                  local_1e8[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_318.data_[lVar14] = dVar25;
              lVar14 = lVar14 + 1;
              pRVar13 = (RotMat3x3d *)
                        ((pRVar13->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 1);
            } while (lVar14 != 3);
            dVar25 = local_318.data_[2] * this->kmag_ - this->omega_ * local_180;
            pcVar6 = (this->jones_).
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar26 = this->E0_ * *(double *)(pcVar6->_M_value + 8);
            local_2c8._8_4_ = SUB84(dVar26,0);
            local_2c8._0_8_ = this->E0_ * *(double *)pcVar6->_M_value;
            local_2c8._12_4_ = (int)((ulong)dVar26 >> 0x20);
            local_298 = dVar25;
            local_338._0_8_ = cexp(0.0);
            local_318.data_[0] = (double)local_2c8._0_8_;
            local_318.data_[1] = (double)local_2c8._8_8_;
            local_338._8_8_ = dVar25;
            std::complex<double>::operator*=
                      ((complex<double> *)&local_318,(complex<double> *)local_338);
            local_2c8._0_8_ = local_318.data_[0];
            pcVar6 = (this->jones_).
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            dVar25 = this->E0_ * *(double *)(pcVar6[1]._M_value + 8);
            local_218._8_4_ = SUB84(dVar25,0);
            local_218._0_8_ = this->E0_ * *(double *)pcVar6[1]._M_value;
            local_218._12_4_ = (int)((ulong)dVar25 >> 0x20);
            uVar23 = SUB84(local_298,0);
            uVar24 = (undefined4)((ulong)local_298 >> 0x20);
            local_338._0_8_ = cexp(0.0);
            local_338._12_4_ = uVar24;
            local_338._8_4_ = uVar23;
            local_318.data_[0] = (double)local_218._0_8_;
            local_318.data_[1] = (double)local_218._8_8_;
            std::complex<double>::operator*=
                      ((complex<double> *)&local_318,(complex<double> *)local_338);
            local_1a8[0] = (double)local_2c8._0_8_;
            local_1a8[1] = local_318.data_[0];
            local_1a8[2] = 0.0;
            local_318.data_[2] = 0.0;
            local_318.data_[0] = 0.0;
            local_318.data_[1] = 0.0;
            lVar14 = 0;
            pRVar13 = local_190;
            do {
              dVar25 = local_318.data_[lVar14];
              lVar16 = 0;
              do {
                dVar25 = dVar25 + (pRVar13->super_SquareMatrix<double,_3>).
                                  super_RectMatrix<double,_3U,_3U>.data_[0][lVar16] *
                                  local_1a8[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_318.data_[lVar14] = dVar25;
              lVar14 = lVar14 + 1;
              pRVar13 = (RotMat3x3d *)
                        ((pRVar13->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + 1);
            } while (lVar14 != 3);
            local_2b8[2] = local_318.data_[2];
            local_2b8[0] = local_318.data_[0];
            local_2b8[1] = local_318.data_[1];
            dVar25 = (this->khat_).super_Vector<double,_3U>.data_[0];
            dVar27 = (this->khat_).super_Vector<double,_3U>.data_[1];
            dVar28 = (this->khat_).super_Vector<double,_3U>.data_[2];
            local_118 = local_318.data_[2];
            dStack_110 = local_318.data_[0];
            local_108 = local_318.data_[0];
            uStack_100 = 0;
            dVar26 = dVar25 * local_318.data_[2] - dVar28 * local_318.data_[0];
            local_338._8_4_ = SUB84(dVar26,0);
            local_338._0_8_ = dVar28 * local_318.data_[1] - dVar27 * local_318.data_[2];
            local_338._12_4_ = (int)((ulong)dVar26 >> 0x20);
            local_f8 = local_318.data_[1];
            dStack_f0 = local_318.data_[2];
            local_328 = local_318.data_[0] * dVar27 - dVar25 * local_318.data_[1];
            local_318.data_[0] = 0.0;
            local_318.data_[1] = 0.0;
            local_318.data_[2] = 0.0;
            lVar14 = 0;
            do {
              local_318.data_[lVar14] = *(double *)(local_338 + lVar14 * 8) / 2997.9245800000003;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_298 = local_318.data_[0];
            uStack_290 = 0;
            local_2c8._8_8_ = local_318.data_[2];
            local_2c8._0_8_ = local_318.data_[1];
            lVar14 = (long)(pAVar21->super_StuntDouble).localIndex_ * 0x18 +
                     *(long *)((long)&(((pAVar21->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).electricField.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar21->super_StuntDouble).storage_);
            lVar16 = 0;
            do {
              *(double *)(lVar14 + lVar16 * 8) =
                   local_2b8[lVar16] + *(double *)(lVar14 + lVar16 * 8);
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            local_228.at_ = pAVar4;
            bVar9 = FixedChargeAdapter::isFixedCharge(&local_228);
            uVar23 = 0;
            uVar24 = 0;
            if (bVar9) {
              RVar8 = FixedChargeAdapter::getCharge(&local_228);
              uVar23 = SUB84(RVar8,0);
              uVar24 = (undefined4)((ulong)RVar8 >> 0x20);
            }
            local_218._4_4_ = uVar24;
            local_218._0_4_ = uVar23;
            local_160.at_ = pAVar4;
            bVar10 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_160);
            dVar25 = (double)local_218._0_8_;
            if (bVar10) {
              DVar7 = (pAVar21->super_StuntDouble).storage_;
              pSVar5 = ((pAVar21->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar14 = (long)(pAVar21->super_StuntDouble).localIndex_;
              dVar25 = *(double *)
                        (*(long *)((long)&(pSVar5->atomData).flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar7) +
                        lVar14 * 8);
              dVar26 = 0.0;
              lVar16 = 0;
              do {
                dVar26 = dVar26 + local_1e8[lVar16] * local_2b8[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              lVar16 = *(long *)((long)&(pSVar5->atomData).flucQFrc.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + DVar7);
              *(double *)(lVar16 + lVar14 * 8) = dVar26 + *(double *)(lVar16 + lVar14 * 8);
              bVar9 = true;
              dVar25 = (double)local_218._0_8_ + dVar25;
            }
            if (bVar9 != false) {
              local_1c8._8_8_ = local_298 * local_138 - local_128 * (double)local_2c8._8_8_;
              local_1c8._0_8_ =
                   (double)local_2c8._8_8_ * dStack_120 - local_138 * (double)local_2c8._0_8_;
              local_1b8 = local_128 * (double)local_2c8._0_8_ - dStack_120 * local_298;
              local_338 = ZEXT816(0);
              local_328 = 0.0;
              lVar14 = 0;
              do {
                *(double *)(local_338 + lVar14 * 8) =
                     local_2b8[lVar14] + *(double *)(local_1c8 + lVar14 * 8);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_318.data_[0] = 0.0;
              local_318.data_[1] = 0.0;
              local_318.data_[2] = 0.0;
              lVar14 = 0;
              do {
                local_318.data_[lVar14] = *(double *)(local_338 + lVar14 * 8) * dVar25;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_248[2] = local_318.data_[2];
              local_248[0] = local_318.data_[0];
              local_248[1] = local_318.data_[1];
              DVar7 = (pAVar21->super_StuntDouble).storage_;
              pSVar5 = ((pAVar21->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar14 = (long)(pAVar21->super_StuntDouble).localIndex_;
              lVar16 = lVar14 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar7);
              lVar19 = 0;
              do {
                *(double *)(lVar16 + lVar19 * 8) =
                     local_248[lVar19] + *(double *)(lVar16 + lVar19 * 8);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              dVar25 = 0.0;
              lVar16 = 0;
              do {
                dVar25 = dVar25 + local_1e8[lVar16] * local_248[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              if (this->doParticlePot == true) {
                lVar16 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar7);
                *(double *)(lVar16 + lVar14 * 8) = *(double *)(lVar16 + lVar14 * 8) - dVar25;
              }
              local_320 = local_320 - dVar25;
            }
            local_168.at_ = pAVar4;
            bVar9 = MultipoleAdapter::isDipole(&local_168);
            if (bVar9) {
              lVar16 = (long)(pAVar21->super_StuntDouble).localIndex_;
              lVar14 = *(long *)((long)&(((pAVar21->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).dipole.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar21->super_StuntDouble).storage_);
              local_328 = (double)*(undefined8 *)(lVar14 + 0x10 + lVar16 * 0x18);
              puVar2 = (undefined8 *)(lVar14 + lVar16 * 0x18);
              local_338._0_8_ = *puVar2;
              local_338._8_8_ = puVar2[1];
              local_318.data_[0] = 0.0;
              local_318.data_[1] = 0.0;
              local_318.data_[2] = 0.0;
              lVar14 = 0;
              do {
                local_318.data_[lVar14] = *(double *)(local_338 + lVar14 * 8) * 0.2081943;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_268[2] = local_318.data_[2];
              local_268[0] = local_318.data_[0];
              local_268[1] = local_318.data_[1];
              local_338._8_8_ = dStack_110 * local_318.data_[2] - dStack_f0 * local_318.data_[0];
              local_338._0_8_ = local_118 * local_318.data_[1] - local_f8 * local_318.data_[2];
              local_328 = local_f8 * local_318.data_[0] - local_108 * local_318.data_[1];
              dVar28 = local_138 * local_298 - (double)local_2c8._8_8_ * local_128;
              dVar26 = local_128 * (double)local_2c8._0_8_ - local_298 * dStack_120;
              dVar27 = dStack_120 * (double)local_2c8._8_8_ - (double)local_2c8._0_8_ * local_138;
              dVar25 = local_318.data_[2] * dVar27 - dVar26 * local_318.data_[0];
              local_1c8._8_4_ = SUB84(dVar25,0);
              local_1c8._0_8_ = local_318.data_[1] * dVar26 - dVar28 * local_318.data_[2];
              local_1c8._12_4_ = (int)((ulong)dVar25 >> 0x20);
              local_1b8 = local_318.data_[0] * dVar28 - dVar27 * local_318.data_[1];
              local_318.data_[0] = 0.0;
              local_318.data_[1] = 0.0;
              local_318.data_[2] = 0.0;
              lVar14 = 0;
              do {
                local_318.data_[lVar14] =
                     *(double *)(local_338 + lVar14 * 8) + *(double *)(local_1c8 + lVar14 * 8);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              lVar14 = 0;
              do {
                local_158[lVar14] = local_318.data_[lVar14] + local_158[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              pSVar5 = ((pAVar21->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar14 = (long)(pAVar21->super_StuntDouble).localIndex_;
              lVar16 = lVar14 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).torque.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar21->super_StuntDouble).storage_);
              lVar19 = 0;
              do {
                *(double *)(lVar16 + lVar19 * 8) =
                     local_158[lVar19] + *(double *)(lVar16 + lVar19 * 8);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              lVar16 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar21->super_StuntDouble).storage_);
              local_208[2] = *(double *)(lVar16 + 0x10 + lVar14 * 0x18);
              pdVar1 = (double *)(lVar16 + lVar14 * 0x18);
              local_208[0] = *pdVar1;
              local_208[1] = pdVar1[1];
              __return_storage_ptr__ = (double (*) [3])local_318.data_;
              (*(pAVar21->super_StuntDouble)._vptr_StuntDouble[5])(__return_storage_ptr__,pAVar21);
              padVar18 = __return_storage_ptr__;
              pSVar20 = &local_b8;
              for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pSVar20->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [0] = (((SquareMatrix3<double> *)padVar18)->super_SquareMatrix<double,_3>).
                      super_RectMatrix<double,_3U,_3U>.data_[0][0];
                padVar18 = (double (*) [3])((long)padVar18 + ((ulong)bVar22 * -2 + 1) * 8);
                pSVar20 = (SquareMatrix3<double> *)((long)pSVar20 + ((ulong)bVar22 * -2 + 1) * 8);
              }
              if ((pAVar21->super_StuntDouble).linear_ == true) {
                uVar3 = (pAVar21->super_StuntDouble).linearAxis_;
                uVar15 = (ulong)(((int)(uVar3 + 1) / 3) * -3 + uVar3 + 1);
                uVar17 = (ulong)(((int)(uVar3 + 2) / 3) * -3 + uVar3 + 2);
                dVar25 = local_208[uVar15];
                dVar26 = *(double *)
                          ((long)local_b8.super_SquareMatrix<double,_3>.
                                 super_RectMatrix<double,_3U,_3U>.data_ + uVar15 * 0x20);
                local_288[uVar3] = 0.0;
                local_288[uVar15] = dVar25 / dVar26;
                local_288[uVar17] =
                     local_208[uVar17] /
                     *(double *)
                      ((long)local_b8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                             .data_ + uVar17 * 0x20);
              }
              else {
                SquareMatrix3<double>::inverse
                          ((SquareMatrix3<double> *)__return_storage_ptr__,&local_b8);
                local_338 = ZEXT816(0);
                local_328 = 0.0;
                lVar14 = 0;
                do {
                  dVar25 = *(double *)(local_338 + lVar14 * 8);
                  lVar16 = 0;
                  do {
                    dVar25 = dVar25 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar16] *
                                      local_208[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 3);
                  *(double *)(local_338 + lVar14 * 8) = dVar25;
                  lVar14 = lVar14 + 1;
                  __return_storage_ptr__ = __return_storage_ptr__ + 1;
                } while (lVar14 != 3);
                local_288[2] = local_328;
                local_288[0] = (double)local_338._0_8_;
                local_288[1] = (double)local_338._8_8_;
              }
              dVar27 = local_288[1] * local_268[2] - local_268[1] * local_288[2];
              dVar25 = local_288[2] * local_268[0] - local_268[2] * local_288[0];
              dVar26 = local_288[0] * local_268[1] - local_268[0] * local_288[1];
              local_248[0] = (double)local_2c8._8_8_ * dVar25 - dVar26 * (double)local_2c8._0_8_;
              local_248[1] = local_298 * dVar26 - dVar27 * (double)local_2c8._8_8_;
              local_248[2] = dVar27 * (double)local_2c8._0_8_ - dVar25 * local_298;
              DVar7 = (pAVar21->super_StuntDouble).storage_;
              pSVar5 = ((pAVar21->super_StuntDouble).snapshotMan_)->currentSnapshot_;
              lVar14 = (long)(pAVar21->super_StuntDouble).localIndex_;
              lVar16 = lVar14 * 0x18 +
                       *(long *)((long)&(pSVar5->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + DVar7);
              lVar19 = 0;
              do {
                *(double *)(lVar16 + lVar19 * 8) =
                     local_248[lVar19] + *(double *)(lVar16 + lVar19 * 8);
                lVar19 = lVar19 + 1;
              } while (lVar19 != 3);
              dVar25 = 0.0;
              lVar16 = 0;
              do {
                dVar25 = dVar25 + local_268[lVar16] * local_2b8[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              if (this->doParticlePot == true) {
                lVar16 = *(long *)((long)&(pSVar5->atomData).particlePot.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + DVar7);
                *(double *)(lVar16 + lVar14 * 8) = *(double *)(lVar16 + lVar14 * 8) - dVar25;
              }
              local_320 = local_320 - dVar25;
            }
            ppAVar12 = local_170 + 1;
            if (ppAVar12 ==
                (local_178->atoms_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar21 = (Atom *)0x0;
            }
            else {
              pAVar21 = *ppAVar12;
            }
          } while (pAVar21 != (Atom *)0x0);
        }
        pMVar11 = SimInfo::nextMolecule(this->info_,&local_220);
      } while (pMVar11 != (Molecule *)0x0);
    }
    pSVar5 = this->info_->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials(&local_318,pSVar5);
    local_c8 = local_318.data_[0];
    dStack_c0 = local_318.data_[1];
    local_d8 = local_318.data_[5];
    dStack_d0 = local_318.data_[6];
    local_e8 = local_318.data_[3];
    dStack_e0 = local_318.data_[4];
    local_68.data_[2] = local_320 + local_318.data_[2];
    local_68.data_[0] = local_318.data_[0];
    local_68.data_[1] = local_318.data_[1];
    local_68.data_[3] = local_318.data_[3];
    local_68.data_[4] = local_318.data_[4];
    local_68.data_[5] = local_318.data_[5];
    local_68.data_[6] = local_318.data_[6];
    Snapshot::setLongRangePotentials(pSVar5,&local_68);
  }
  return;
}

Assistant:

void Light::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);
    int l, m, n;
    RealType C {}, U {}, fPot {};
    Vector3d r {}, rp {}, v {}, f {}, trq {}, D {}, J {}, av {};
    Vector3d EFk {}, EF {}, BF {};
    Mat3x3d I {};

    bool isCharge;

    if (doLight) {
      RealType t = info_->getSnapshotManager()->getCurrentSnapshot()->getTime();
      U          = 0.0;
      fPot       = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          // We are not wrapping coordinates for light interactions:
          r = atom->getPos();
          v = atom->getVel();

          rp = A_ * r;  // atom's position in frame of light propagation

          // e^{ i (k*z - omega * t) } is the main oscillatory component:
          std::complex<RealType> argument(0.0, kmag_ * rp.z() - omega_ * t);
          std::complex<RealType> Ex = E0_ * jones_[0] * std::exp(argument);
          std::complex<RealType> Ey = E0_ * jones_[1] * std::exp(argument);

          EFk.x() = Ex.real();
          EFk.y() = Ey.real();
          EFk.z() = 0.0;

          EF = Ainv_ * EFk;  // electric field rotated back into lab coordinates

          // The magnetic field (BF) is perpendicular to both electric field
          // and light propagation direction:

          BF = cross(EF, khat_) / Constants::c;

          atom->addElectricField(EF);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF));
          }

          if (isCharge) {
            f = C * (EF + cross(v, BF));
            atom->addFrc(f);
            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleConvert;

            trq += cross(D, EF) + cross(D, cross(v, BF));

            atom->addTrq(trq);

            J = atom->getJ();
            I = atom->getI();
            if (atom->isLinear()) {
              l     = atom->linearAxis();
              m     = (l + 1) % 3;
              n     = (l + 2) % 3;
              av[l] = 0;
              av[m] = J[m] / I(m, m);
              av[n] = J[n] / I(n, n);
            } else {
              av = I.inverse() * J;
            }

            f = cross(cross(av, D), BF);
            atom->addFrc(f);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }